

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
           *this,List<long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list,int index)

{
  Type plVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  
  if ((index < 0) ||
     (iVar4 = (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).count,
     iVar4 <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    iVar4 = (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).count;
  }
  for (lVar6 = (long)(index + 1); (int)lVar6 < iVar4; lVar6 = lVar6 + 1) {
    plVar1 = (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).buffer;
    plVar1[index] = plVar1[lVar6];
    index = index + 1;
  }
  (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).count = iVar4 + -1;
  (list->super_ReadOnlyList<long,_Memory::HeapAllocator,_DefaultComparer>).buffer[iVar4 + -1] = 0;
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }